

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<long,_std::allocator<long>_>::PODVector
          (PODVector<long,_std::allocator<long>_> *this,size_type a_size,
          value_type_conflict2 *a_value,allocator_type *a_allocator)

{
  allocator<long> *in_RCX;
  unsigned_long in_RDX;
  long *in_RSI;
  allocator<long> *in_RDI;
  PODVector<long,_std::allocator<long>_> *unaff_retaddr;
  allocator<long> *a_num_to_be_added;
  
  a_num_to_be_added = in_RDI;
  std::allocator<long>::allocator(in_RCX,in_RDI);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  GetNewCapacity(unaff_retaddr,(size_type)a_num_to_be_added);
  AllocateBuffer((PODVector<long,_std::allocator<long>_> *)a_value,(size_type)a_allocator);
  *(long **)(in_RDI + 8) = in_RSI;
  detail::uninitializedFillNImpl<std::allocator<long>,long,unsigned_long,long>
            (in_RSI,in_RDX,(long *)in_RCX,in_RDI);
  return;
}

Assistant:

PODVector (size_type a_size, const value_type& a_value,
                   const allocator_type& a_allocator = Allocator()) noexcept
            : Allocator(a_allocator), m_data(nullptr), m_size(0), m_capacity(0)
        {
            AllocateBuffer(GetNewCapacity(a_size));
            m_size = a_size;
            detail::uninitializedFillNImpl<Allocator>(m_data, a_size, a_value, *this);
        }